

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O2

int __thiscall QAbstractAnimation::totalDuration(QAbstractAnimation *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (**(code **)(*(long *)this + 0x60))();
  if (0 < iVar1) {
    iVar2 = loopCount(this);
    iVar1 = iVar1 * iVar2;
    if (iVar2 < 0) {
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

int QAbstractAnimation::totalDuration() const
{
    int dura = duration();
    if (dura <= 0)
        return dura;
    int loopcount = loopCount();
    if (loopcount < 0)
        return -1;
    return dura * loopcount;
}